

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::TryCatchStatement(SQCompiler *this)

{
  SQScope *pSVar1;
  long *plVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  long lVar5;
  SQUnsignedInteger SVar6;
  SQInteger SVar7;
  SQFuncState *pSVar8;
  SQObject SVar9;
  SQScope __oldscope__;
  SQScope __oldscope___1;
  SQObject local_68;
  long local_50;
  SQInstruction local_48;
  SQInteger SStack_40;
  SQInstruction local_38;
  
  SVar7 = SQLexer::Lex(&this->_lex);
  this->_token = SVar7;
  local_68._type = 0;
  local_68._4_4_ = 0x37;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
  pSVar8 = this->_fs;
  pSVar8->_traps = pSVar8->_traps + 1;
  SVar3 = (pSVar8->_breaktargets)._size;
  if (SVar3 != 0) {
    plVar2 = (pSVar8->_breaktargets)._vals + (SVar3 - 1);
    *plVar2 = *plVar2 + 1;
  }
  SVar3 = (pSVar8->_continuetargets)._size;
  if (SVar3 != 0) {
    plVar2 = (pSVar8->_continuetargets)._vals + (SVar3 - 1);
    *plVar2 = *plVar2 + 1;
  }
  SVar3 = (pSVar8->_instructions)._size;
  pSVar1 = &this->_scope;
  local_68._0_8_ = (this->_scope).outers;
  local_68._unVal = (SQObjectValue)(this->_scope).stacksize;
  (this->_scope).outers = pSVar8->_outers;
  SVar7 = SQFuncState::GetStackSize(pSVar8);
  (this->_scope).stacksize = SVar7;
  Statement(this,true);
  lVar4 = this->_fs->_outers;
  SVar7 = SQFuncState::GetStackSize(this->_fs);
  pSVar8 = this->_fs;
  lVar5 = (this->_scope).stacksize;
  if (SVar7 != lVar5) {
    SQFuncState::SetStackSize(pSVar8,lVar5);
    pSVar8 = this->_fs;
    if (lVar4 != pSVar8->_outers) {
      local_48.op = '<';
      local_48._arg0 = '\0';
      local_48._arg2 = '\0';
      local_48._arg3 = '\0';
      local_48._arg1 = (SQInt32)(this->_scope).stacksize;
      SQFuncState::AddInstruction(pSVar8,&local_48);
      pSVar8 = this->_fs;
    }
  }
  pSVar1->outers = local_68._0_8_;
  (this->_scope).stacksize = (SQInteger)local_68._unVal;
  pSVar8->_traps = pSVar8->_traps + -1;
  local_68._type = 0;
  local_68._4_4_ = 0x138;
  SQFuncState::AddInstruction(pSVar8,(SQInstruction *)&local_68);
  pSVar8 = this->_fs;
  SVar6 = (pSVar8->_breaktargets)._size;
  if (SVar6 != 0) {
    plVar2 = (pSVar8->_breaktargets)._vals + (SVar6 - 1);
    *plVar2 = *plVar2 + -1;
  }
  lVar4 = SVar3 - 1;
  SVar6 = (pSVar8->_continuetargets)._size;
  if (SVar6 != 0) {
    plVar2 = (pSVar8->_continuetargets)._vals + (SVar6 - 1);
    *plVar2 = *plVar2 + -1;
  }
  local_68._type = 0;
  local_68._4_4_ = 0x1c;
  SQFuncState::AddInstruction(pSVar8,(SQInstruction *)&local_68);
  SVar6 = (this->_fs->_instructions)._size;
  local_50 = SVar6 - 1;
  SQFuncState::SetInstructionParam(this->_fs,lVar4,1,SVar6 - SVar3);
  Expect(this,0x126);
  Expect(this,0x28);
  SVar9 = Expect(this,0x102);
  local_68._unVal = SVar9._unVal;
  local_68._type = SVar9._type;
  Expect(this,0x29);
  local_48 = (SQInstruction)pSVar1->outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar8 = this->_fs;
  (this->_scope).outers = pSVar8->_outers;
  SVar7 = SQFuncState::GetStackSize(pSVar8);
  (this->_scope).stacksize = SVar7;
  SVar7 = SQFuncState::PushLocalVariable(this->_fs,&local_68);
  SQFuncState::SetInstructionParam(this->_fs,lVar4,0,SVar7);
  Statement(this,true);
  SQFuncState::SetInstructionParams
            (this->_fs,local_50,0,(this->_fs->_instructions)._size - SVar6,0,0);
  lVar4 = this->_fs->_outers;
  SVar7 = SQFuncState::GetStackSize(this->_fs);
  lVar5 = (this->_scope).stacksize;
  if (SVar7 != lVar5) {
    SQFuncState::SetStackSize(this->_fs,lVar5);
    if (lVar4 != this->_fs->_outers) {
      local_38._arg1 = (SQInt32)(this->_scope).stacksize;
      local_38.op = '<';
      local_38._arg0 = '\0';
      local_38._arg2 = '\0';
      local_38._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_38);
    }
  }
  pSVar1->outers = (SQInteger)local_48;
  (this->_scope).stacksize = SStack_40;
  return;
}

Assistant:

void TryCatchStatement()
    {
        SQObject exid;
        Lex();
        _fs->AddInstruction(_OP_PUSHTRAP,0,0);
        _fs->_traps++;
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()++;
        SQInteger trappos = _fs->GetCurrentPos();
        {
            BEGIN_SCOPE();
            Statement();
            END_SCOPE();
        }
        _fs->_traps--;
        _fs->AddInstruction(_OP_POPTRAP, 1, 0);
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
        _fs->AddInstruction(_OP_JMP, 0, 0);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));
        Expect(TK_CATCH); Expect(_SC('(')); exid = Expect(TK_IDENTIFIER); Expect(_SC(')'));
        {
            BEGIN_SCOPE();
            SQInteger ex_target = _fs->PushLocalVariable(exid);
            _fs->SetInstructionParam(trappos, 0, ex_target);
            Statement();
            _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
            END_SCOPE();
        }
    }